

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall
Js::FunctionBody::RecordCrossFrameEntryExitRecord
          (FunctionBody *this,uint byteCodeOffset,bool isEnterBlock)

{
  Recycler *this_00;
  code *pcVar1;
  bool bVar2;
  Recycler *alloc;
  List<Js::FunctionBody::CrossFrameEntryExitRecord,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer>
  *ptr;
  AuxStatementData *pAVar3;
  undefined4 *puVar4;
  undefined **local_50;
  CrossFrameEntryExitRecord record;
  
  EnsureAuxStatementData(this);
  pAVar3 = (this->m_sourceInfo).m_auxStatementData.ptr;
  this_00 = ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->recycler;
  if ((pAVar3 == (AuxStatementData *)0x0) ||
     ((pAVar3->m_crossFrameBlockEntryExisRecords).ptr ==
      (List<Js::FunctionBody::CrossFrameEntryExitRecord,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0)) {
    local_50 = &JsUtil::
                List<Js::FunctionBody::CrossFrameEntryExitRecord,Memory::Recycler,true,Js::CopyRemovePolicy,DefaultComparer>
                ::typeinfo;
    record.m_byteCodeOffset = 0;
    record.m_isEnterBlock = false;
    record._5_3_ = 0;
    alloc = Memory::Recycler::TrackAllocInfo(this_00,(TrackAllocData *)&stack0xffffffffffffffb0);
    ptr = (List<Js::FunctionBody::CrossFrameEntryExitRecord,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer>
           *)new<Memory::Recycler>(0x30,alloc,0x37a1d4);
    (ptr->
    super_ReadOnlyList<Js::FunctionBody::CrossFrameEntryExitRecord,_Memory::Recycler,_DefaultComparer>
    ).alloc = this_00;
    (ptr->
    super_ReadOnlyList<Js::FunctionBody::CrossFrameEntryExitRecord,_Memory::Recycler,_DefaultComparer>
    )._vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_01377dc8;
    (ptr->
    super_ReadOnlyList<Js::FunctionBody::CrossFrameEntryExitRecord,_Memory::Recycler,_DefaultComparer>
    ).buffer.ptr = (CrossFrameEntryExitRecord *)0x0;
    (ptr->
    super_ReadOnlyList<Js::FunctionBody::CrossFrameEntryExitRecord,_Memory::Recycler,_DefaultComparer>
    ).count = 0;
    ptr->length = 0;
    ptr->increment = 4;
    Memory::
    WriteBarrierPtr<JsUtil::List<Js::FunctionBody::CrossFrameEntryExitRecord,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer>_>
    ::WriteBarrierSet(&((this->m_sourceInfo).m_auxStatementData.ptr)->
                       m_crossFrameBlockEntryExisRecords,ptr);
    pAVar3 = (this->m_sourceInfo).m_auxStatementData.ptr;
    if (pAVar3 != (AuxStatementData *)0x0) goto LAB_006d6859;
  }
  else {
LAB_006d6859:
    if ((pAVar3->m_crossFrameBlockEntryExisRecords).ptr !=
        (List<Js::FunctionBody::CrossFrameEntryExitRecord,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer>
         *)0x0) goto LAB_006d68af;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar4 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                              ,0x1f6a,"(this->GetCrossFrameEntryExitRecords())",
                              "this->GetCrossFrameEntryExitRecords()");
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar4 = 0;
LAB_006d68af:
  CrossFrameEntryExitRecord::CrossFrameEntryExitRecord
            ((CrossFrameEntryExitRecord *)&stack0xffffffffffffffb0,byteCodeOffset,isEnterBlock);
  JsUtil::
  List<Js::FunctionBody::CrossFrameEntryExitRecord,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer>
  ::Add((((this->m_sourceInfo).m_auxStatementData.ptr)->m_crossFrameBlockEntryExisRecords).ptr,
        (CrossFrameEntryExitRecord *)&stack0xffffffffffffffb0);
  return;
}

Assistant:

void FunctionBody::RecordCrossFrameEntryExitRecord(uint byteCodeOffset, bool isEnterBlock)
    {
        this->EnsureAuxStatementData();

        Recycler* recycler = this->m_scriptContext->GetRecycler();
        if (this->GetCrossFrameEntryExitRecords() == nullptr)
        {
            m_sourceInfo.m_auxStatementData->m_crossFrameBlockEntryExisRecords = RecyclerNew(recycler, CrossFrameEntryExitRecordList, recycler);
        }
        Assert(this->GetCrossFrameEntryExitRecords());

        CrossFrameEntryExitRecord record(byteCodeOffset, isEnterBlock);
        this->GetCrossFrameEntryExitRecords()->Add(record); // Will copy stack value and put the copy into the container.
    }